

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O0

int __thiscall
GameTitle::calculateNewPosition
          (GameTitle *this,int currentPos,int animationLength,int start,int finish,bool direction)

{
  undefined8 local_38;
  double positionMove;
  bool direction_local;
  int finish_local;
  int start_local;
  int animationLength_local;
  int currentPos_local;
  GameTitle *this_local;
  
  local_38 = (double)((finish - start) / (animationLength * 0x18));
  if (local_38 < 1.0) {
    local_38 = 1.0;
  }
  if (direction) {
    start_local = (int)((double)currentPos + local_38);
    if (finish <= start_local) {
      start_local = finish;
    }
    this_local._4_4_ = start_local;
  }
  else {
    start_local = (int)((double)currentPos - local_38);
    if (start_local < finish) {
      start_local = finish;
    }
    this_local._4_4_ = start_local;
  }
  return this_local._4_4_;
}

Assistant:

int GameTitle::calculateNewPosition(int currentPos, int animationLength, int start, volatile int finish, bool direction) {
    double positionMove = (finish - start) / (animationLength * FRAMES_PER_SECOND);

    if(positionMove < 1){
        positionMove = 1;
    }

    if(direction == DOWN){
        currentPos += positionMove;

        if(currentPos >= finish){
            currentPos = finish;
        }

        return currentPos;
    }
    else {
        currentPos -= positionMove;

        if(currentPos < finish){
            currentPos = finish;
        }

        return currentPos;
    }

}